

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_SetTrustedCert(IOTHUB_MESSAGING_HANDLE messagingHandle,char *trusted_cert)

{
  int iVar1;
  char *local_30;
  char *temp_cert;
  LOGGER_LOG l;
  char *pcStack_18;
  IOTHUB_MESSAGING_RESULT result;
  char *trusted_cert_local;
  IOTHUB_MESSAGING_HANDLE messagingHandle_local;
  
  pcStack_18 = trusted_cert;
  trusted_cert_local = (char *)messagingHandle;
  if ((messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0) || (trusted_cert == (char *)0x0)) {
    temp_cert = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)temp_cert != (LOGGER_LOG)0x0) {
      (*(code *)temp_cert)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                 ,"IoTHubMessaging_LL_SetTrustedCert",0x621,1,
                 "Invalid argument messagingHandle: %p trusted_cert: %p",trusted_cert_local,
                 pcStack_18);
    }
    l._4_4_ = IOTHUB_MESSAGING_INVALID_ARG;
  }
  else {
    local_30 = (char *)0x0;
    iVar1 = mallocAndStrcpy_s(&local_30,trusted_cert);
    if (iVar1 == 0) {
      if (*(long *)(trusted_cert_local + 0x30) != 0) {
        free(*(void **)(trusted_cert_local + 0x30));
      }
      *(char **)(trusted_cert_local + 0x30) = local_30;
      l._4_4_ = IOTHUB_MESSAGING_OK;
    }
    else {
      l._4_4_ = IOTHUB_MESSAGING_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_SetTrustedCert(IOTHUB_MESSAGING_HANDLE messagingHandle, const char* trusted_cert)
{
    IOTHUB_MESSAGING_RESULT result;

    if (messagingHandle == NULL || trusted_cert == NULL)
    {
        LogError("Invalid argument messagingHandle: %p trusted_cert: %p", messagingHandle, trusted_cert);
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else
    {
        char* temp_cert = NULL;
        if (mallocAndStrcpy_s(&temp_cert, trusted_cert) != 0)
        {
            result = IOTHUB_MESSAGING_ERROR;
        }
        else
        {
            if (messagingHandle->trusted_cert != NULL)
            {
                free(messagingHandle->trusted_cert);
            }
            messagingHandle->trusted_cert = temp_cert;
            result = IOTHUB_MESSAGING_OK;
        }
    }
    return result;
}